

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O0

int filemgr_is_writable(filemgr *file,bid_t bid)

{
  bool bVar1;
  atomic<unsigned_long> *atomic_val;
  atomic<unsigned_long> *paVar2;
  atomic<unsigned_long> *paVar3;
  bid_t in_RSI;
  filemgr *in_RDI;
  uint64_t pos;
  superblock *in_stack_ffffffffffffffc8;
  bool local_21;
  uint local_4;
  
  bVar1 = sb_bmp_exists(in_stack_ffffffffffffffc8);
  if ((bVar1) && (sb_ops.is_writable != (_func_bool_filemgr_ptr_bid_t *)0x0)) {
    local_21 = (*sb_ops.is_writable)(in_RDI,in_RSI);
  }
  else {
    atomic_val = (atomic<unsigned_long> *)(in_RSI * in_RDI->blocksize);
    paVar3 = atomic_val;
    paVar2 = (atomic<unsigned_long> *)
             atomic_get_uint64_t(atomic_val,(memory_order)((ulong)in_stack_ffffffffffffffc8 >> 0x20)
                                );
    local_21 = false;
    if (paVar3 < paVar2) {
      paVar3 = (atomic<unsigned_long> *)
               atomic_get_uint64_t(paVar3,(memory_order)((ulong)atomic_val >> 0x20));
      local_21 = paVar3 <= atomic_val;
    }
  }
  local_4 = (uint)local_21;
  return local_4;
}

Assistant:

int filemgr_is_writable(struct filemgr *file, bid_t bid)
{
    if (sb_bmp_exists(file->sb) && sb_ops.is_writable) {
        // block reusing is enabled
        return sb_ops.is_writable(file, bid);
    } else {
        uint64_t pos = bid * file->blocksize;
        // Note that we don't need to grab file->lock here because
        // 1) both file->pos and file->last_commit are only incremented.
        // 2) file->last_commit is updated using the value of file->pos,
        //    and always equal to or smaller than file->pos.
        return (pos <  atomic_get_uint64_t(&file->pos) &&
                pos >= atomic_get_uint64_t(&file->last_commit));
    }
}